

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O0

void __thiscall dd::TaskQueueStdlib::Delete(TaskQueueStdlib *this)

{
  bool bVar1;
  AutoLock local_18;
  AutoLock lock_;
  TaskQueueStdlib *this_local;
  
  lock_._lock = (Lock *)this;
  bVar1 = TaskQueueBase::IsCurrent(&this->super_TaskQueueBase);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/linux/task_queue_stdlib.cc"
                  ,0x56,"virtual void dd::TaskQueueStdlib::Delete()");
  }
  AutoLock::AutoLock(&local_18,&this->_pending_lock);
  this->_thread_should_quit = true;
  AutoLock::~AutoLock(&local_18);
  NotifyWake(this);
  Event::Wait(&this->_stopped,-1);
  PlatformThread::Stop(&this->_thread);
  if (this != (TaskQueueStdlib *)0x0) {
    ~TaskQueueStdlib(this);
    operator_delete(this,0x2b8);
  }
  return;
}

Assistant:

void TaskQueueStdlib::Delete()
	{
		assert(!IsCurrent());
		{
			AutoLock lock_(_pending_lock);
			_thread_should_quit = true;
		}
		NotifyWake();
		_stopped.Wait(-1);
		_thread.Stop();
		delete this;
	}